

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_decoder.cc
# Opt level: O3

int __thiscall
webrtc::AudioDecoder::DecodeRedundant
          (AudioDecoder *this,uint8_t *encoded,size_t encoded_len,int sample_rate_hz,
          size_t max_decoded_bytes,int16_t *decoded,SpeechType *speech_type)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  TraceEndOnScopeClose trace_event_unique_profileScope36;
  TraceEndOnScopeClose local_48;
  
  if (DecodeRedundant::trace_event_unique_catstatic36 == (uchar *)0x0) {
    DecodeRedundant::trace_event_unique_catstatic36 = EventTracer::GetCategoryEnabled("webrtc");
  }
  local_48.p_data_ = (Data *)0x0;
  if (*DecodeRedundant::trace_event_unique_catstatic36 != '\0') {
    EventTracer::AddTraceEvent
              ('B',DecodeRedundant::trace_event_unique_catstatic36,"AudioDecoder::DecodeRedundant",0
               ,0,(char **)0x0,(uchar *)0x0,(unsigned_long_long *)0x0,'\0');
    local_48.p_data_ = &local_48.data_;
    local_48.data_.category_enabled = DecodeRedundant::trace_event_unique_catstatic36;
    local_48.data_.name = "AudioDecoder::DecodeRedundant";
  }
  iVar1 = (*this->_vptr_AudioDecoder[8])(this,encoded,encoded_len);
  if (-1 < iVar1) {
    iVar2 = (*this->_vptr_AudioDecoder[0xb])(this);
    uVar3 = CONCAT44(extraout_var,iVar2) * (ulong)(uint)(iVar1 * 2);
    iVar1 = -1;
    if (max_decoded_bytes <= uVar3 && uVar3 - max_decoded_bytes != 0) goto LAB_0014f33d;
  }
  iVar1 = (*this->_vptr_AudioDecoder[0xd])
                    (this,encoded,encoded_len,(ulong)(uint)sample_rate_hz,decoded,speech_type);
LAB_0014f33d:
  trace_event_internal::TraceEndOnScopeClose::~TraceEndOnScopeClose(&local_48);
  return iVar1;
}

Assistant:

int AudioDecoder::DecodeRedundant(const uint8_t* encoded, size_t encoded_len,
                                  int sample_rate_hz, size_t max_decoded_bytes,
                                  int16_t* decoded, SpeechType* speech_type) {
  TRACE_EVENT0("webrtc", "AudioDecoder::DecodeRedundant");
  int duration = PacketDurationRedundant(encoded, encoded_len);
  if (duration >= 0 &&
      duration * Channels() * sizeof(int16_t) > max_decoded_bytes) {
    return -1;
  }
  return DecodeRedundantInternal(encoded, encoded_len, sample_rate_hz, decoded,
                                 speech_type);
}